

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

int LogL16InitState(TIFF *tif)

{
  int iVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint uVar4;
  tmsize_t tVar5;
  void *pvVar6;
  undefined4 uVar7;
  ulong first;
  
  puVar3 = tif->tif_data;
  if (puVar3 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x543,"int LogL16InitState(TIFF *)");
  }
  if ((tif->tif_dir).td_photometric != 0x804c) {
    __assert_fail("td->td_photometric == PHOTOMETRIC_LOGL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x544,"int LogL16InitState(TIFF *)");
  }
  if ((tif->tif_dir).td_samplesperpixel != 1) {
    TIFFErrorExtR(tif,"LogL16InitState","Sorry, can not handle LogL image with %s=%u",
                  "Samples/pixel");
    return 0;
  }
  if (*(int *)(puVar3 + 4) != -1) goto LAB_002ac70b;
  uVar4 = (uint)(tif->tif_dir).td_sampleformat |
          (uint)(tif->tif_dir).td_samplesperpixel << 3 | (uint)(tif->tif_dir).td_bitspersample << 6;
  if (uVar4 < 0x409) {
    if ((uVar4 == 0x209) || (uVar4 == 0x20c)) {
      uVar7 = 3;
    }
    else {
LAB_002ac702:
      uVar7 = 0xffffffff;
    }
  }
  else if ((uVar4 - 0x409 < 4) && (uVar4 - 0x409 != 2)) {
    uVar7 = 1;
  }
  else {
    uVar7 = 0;
    if (uVar4 != 0x80b) goto LAB_002ac702;
  }
  *(undefined4 *)(puVar3 + 4) = uVar7;
LAB_002ac70b:
  iVar1 = *(int *)(puVar3 + 4);
  if (iVar1 == 0) {
    uVar7 = 4;
  }
  else if (iVar1 == 3) {
    uVar7 = 1;
  }
  else {
    if (iVar1 != 1) {
      TIFFErrorExtR(tif,"LogL16InitState","No support for converting user data format to LogL");
      return 0;
    }
    uVar7 = 2;
  }
  *(undefined4 *)(puVar3 + 0xc) = uVar7;
  if ((tif->tif_flags & 0x400) == 0) {
    uVar4 = (tif->tif_dir).td_rowsperstrip;
    first = (ulong)(tif->tif_dir).td_imagewidth;
    uVar2 = (tif->tif_dir).td_imagelength;
    if (uVar2 <= uVar4) {
      uVar4 = uVar2;
    }
  }
  else {
    first = (ulong)(tif->tif_dir).td_tilewidth;
    uVar4 = (tif->tif_dir).td_tilelength;
  }
  tVar5 = _TIFFMultiplySSize((TIFF *)0x0,first,(ulong)uVar4,(char *)0x0);
  *(tmsize_t *)(puVar3 + 0x18) = tVar5;
  tVar5 = _TIFFMultiplySSize((TIFF *)0x0,*(tmsize_t *)(puVar3 + 0x18),2,(char *)0x0);
  if (tVar5 != 0) {
    pvVar6 = _TIFFmallocExt(tif,*(long *)(puVar3 + 0x18) * 2);
    *(void **)(puVar3 + 0x10) = pvVar6;
    if (pvVar6 != (void *)0x0) {
      return 1;
    }
  }
  TIFFErrorExtR(tif,"LogL16InitState","No space for SGILog translation buffer");
  return 0;
}

Assistant:

static int LogL16InitState(TIFF *tif)
{
    static const char module[] = "LogL16InitState";
    TIFFDirectory *td = &tif->tif_dir;
    LogLuvState *sp = DecoderState(tif);

    assert(sp != NULL);
    assert(td->td_photometric == PHOTOMETRIC_LOGL);

    if (td->td_samplesperpixel != 1)
    {
        TIFFErrorExtR(tif, module,
                      "Sorry, can not handle LogL image with %s=%" PRIu16,
                      "Samples/pixel", td->td_samplesperpixel);
        return 0;
    }

    /* for some reason, we can't do this in TIFFInitLogL16 */
    if (sp->user_datafmt == SGILOGDATAFMT_UNKNOWN)
        sp->user_datafmt = LogL16GuessDataFmt(td);
    switch (sp->user_datafmt)
    {
        case SGILOGDATAFMT_FLOAT:
            sp->pixel_size = sizeof(float);
            break;
        case SGILOGDATAFMT_16BIT:
            sp->pixel_size = sizeof(int16_t);
            break;
        case SGILOGDATAFMT_8BIT:
            sp->pixel_size = sizeof(uint8_t);
            break;
        default:
            TIFFErrorExtR(tif, module,
                          "No support for converting user data format to LogL");
            return (0);
    }
    if (isTiled(tif))
        sp->tbuflen = multiply_ms(td->td_tilewidth, td->td_tilelength);
    else if (td->td_rowsperstrip < td->td_imagelength)
        sp->tbuflen = multiply_ms(td->td_imagewidth, td->td_rowsperstrip);
    else
        sp->tbuflen = multiply_ms(td->td_imagewidth, td->td_imagelength);
    if (multiply_ms(sp->tbuflen, sizeof(int16_t)) == 0 ||
        (sp->tbuf = (uint8_t *)_TIFFmallocExt(
             tif, sp->tbuflen * sizeof(int16_t))) == NULL)
    {
        TIFFErrorExtR(tif, module, "No space for SGILog translation buffer");
        return (0);
    }
    return (1);
}